

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int Saig_ManBmcLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    uVar5 = pObj->Id;
    if ((int)uVar5 < 0) goto LAB_0056ecb1;
  }
  else {
    uVar5 = pObj->Id;
    if ((long)(int)uVar5 < 0) goto LAB_0056ecb1;
    uVar1 = p->vMapping->nSize;
    if ((int)uVar1 <= (int)uVar5) goto LAB_0056ecb1;
    uVar2 = p->vMapping->pArray[(int)uVar5];
    if (uVar2 == 0) {
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x36d,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    if (((int)uVar2 < 0) || (uVar1 <= uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  if ((int)uVar5 < p->vId2Num->nSize) {
    iVar3 = p->vId2Num->pArray[uVar5];
    if ((long)iVar3 < 0) {
      __assert_fail("ObjNum >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x36f,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    if ((iFrame < 0) || (p->vId2Var->nSize <= iFrame)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar4 = p->vId2Var->pArray[(uint)iFrame];
    if (pvVar4 == (void *)0x0) {
      __assert_fail("vFrame != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x371,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    if (iVar3 < *(int *)((long)pvVar4 + 4)) {
      return *(int *)(*(long *)((long)pvVar4 + 8) + (long)iVar3 * 4);
    }
  }
LAB_0056ecb1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Saig_ManBmcLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    assert( ObjNum >= 0 );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    assert( vFrame != NULL );
    return Vec_IntEntry( vFrame, ObjNum );
}